

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeCommitPhaseTwo(Btree *p,int bCleanup)

{
  int iVar1;
  int in_ESI;
  long in_RDI;
  BtShared *pBt;
  int rc;
  Pager *in_stack_ffffffffffffffd8;
  Btree *in_stack_ffffffffffffffe0;
  
  if (*(char *)(in_RDI + 0x10) != '\0') {
    sqlite3BtreeEnter((Btree *)0x13cfe2);
    if (*(char *)(in_RDI + 0x10) == '\x02') {
      in_stack_ffffffffffffffe0 = *(Btree **)(in_RDI + 8);
      iVar1 = sqlite3PagerCommitPhaseTwo(in_stack_ffffffffffffffd8);
      if ((iVar1 != 0) && (in_ESI == 0)) {
        sqlite3BtreeLeave((Btree *)0x13d02f);
        return iVar1;
      }
      *(int *)(in_RDI + 0x1c) = *(int *)(in_RDI + 0x1c) + -1;
      *(undefined1 *)((long)&in_stack_ffffffffffffffe0->pNext + 4) = 1;
      btreeClearHasContent((BtShared *)0x13d05a);
    }
    btreeEndTransaction(in_stack_ffffffffffffffe0);
    sqlite3BtreeLeave((Btree *)0x13d06e);
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCommitPhaseTwo(Btree *p, int bCleanup){

  if( p->inTrans==TRANS_NONE ) return SQLITE_OK;
  sqlite3BtreeEnter(p);
  btreeIntegrity(p);

  /* If the handle has a write-transaction open, commit the shared-btrees
  ** transaction and set the shared state to TRANS_READ.
  */
  if( p->inTrans==TRANS_WRITE ){
    int rc;
    BtShared *pBt = p->pBt;
    assert( pBt->inTransaction==TRANS_WRITE );
    assert( pBt->nTransaction>0 );
    rc = sqlite3PagerCommitPhaseTwo(pBt->pPager);
    if( rc!=SQLITE_OK && bCleanup==0 ){
      sqlite3BtreeLeave(p);
      return rc;
    }
    p->iBDataVersion--;  /* Compensate for pPager->iDataVersion++; */
    pBt->inTransaction = TRANS_READ;
    btreeClearHasContent(pBt);
  }

  btreeEndTransaction(p);
  sqlite3BtreeLeave(p);
  return SQLITE_OK;
}